

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall
wallet::CWallet::UnsetWalletFlagWithDB(CWallet *this,WalletBatch *batch,uint64_t flag)

{
  bool bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  unique_lock<std::recursive_mutex> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_80._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_80._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_80);
  LOCK();
  (this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i =
       (this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i & ~flag;
  UNLOCK();
  bVar1 = WalletBatch::WriteWalletFlags
                    (batch,(this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i);
  if (bVar1) {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_80);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"UnsetWalletFlagWithDB","");
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70,": writing wallet flags failed");
    local_50 = (size_type *)(pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50 == paVar3) {
      local_40 = paVar3->_M_allocated_capacity;
      uStack_38 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_50 = &local_40;
    }
    else {
      local_40 = paVar3->_M_allocated_capacity;
    }
    local_48 = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::UnsetWalletFlagWithDB(WalletBatch& batch, uint64_t flag)
{
    LOCK(cs_wallet);
    m_wallet_flags &= ~flag;
    if (!batch.WriteWalletFlags(m_wallet_flags))
        throw std::runtime_error(std::string(__func__) + ": writing wallet flags failed");
}